

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::
     local_scan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
               (int *begin,int *end)

{
  int iVar1;
  
  if (end != begin) {
    iVar1 = *begin;
    while (begin = begin + 1, begin != end) {
      if (*begin < iVar1) {
        iVar1 = *begin;
      }
      *begin = iVar1;
    }
  }
  return;
}

Assistant:

void local_scan_inplace(Iterator begin, Iterator end, Func func) {
    // return if there's nothing here
    if (std::distance(begin, end) == 0)
        return;
    typedef typename std::iterator_traits<Iterator>::value_type T;

    // start from first element
    T val = *begin;
    ++begin;

    // calculate the inclusive prefix sum
    while (begin != end) {
        val = func(val,*begin);
        *begin = val;
        ++begin;
    }
}